

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void * alsaMidiHandler(void *ptr)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  code *pcVar6;
  long lVar7;
  snd_seq_event_t *psVar8;
  const_iterator __position;
  uchar *puVar9;
  byte *pbVar10;
  pointer puVar11;
  int iVar12;
  long lVar13;
  reference pvVar14;
  size_type sVar15;
  uchar *puVar16;
  snd_seq_event_t *psVar17;
  nfds_t __nfds;
  undefined8 uStack_130;
  undefined1 auStack_128 [24];
  uchar *local_110;
  long local_108;
  uint local_100;
  int local_fc;
  ssize_t local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  code *local_e0;
  RtMidiCallback callback;
  int nsec_1;
  int nsec;
  timespec y;
  snd_seq_real_time_t *x;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  const_iterator local_a8;
  undefined4 local_a0;
  undefined1 local_99;
  int res;
  bool dummy;
  uchar *buffer;
  int local_7c;
  byte *pbStack_78;
  int result;
  snd_seq_event_t *ev;
  pollfd *poll_fds;
  undefined1 local_60 [4];
  int poll_fd_count;
  MidiMessage message;
  bool doDecode;
  bool continueSysex;
  double time;
  long nBytes;
  AlsaMidiData *apiData;
  RtMidiInData *data;
  void *ptr_local;
  
  psVar17 = (snd_seq_event_t *)auStack_128;
  puVar4 = *(undefined8 **)((long)ptr + 0x40);
  message.timeStamp._7_1_ = 0;
  message.timeStamp._6_1_ = 0;
  uStack_130 = 0x1120d4;
  MidiInApi::MidiMessage::MidiMessage((MidiMessage *)local_60);
  *(undefined4 *)(puVar4 + 4) = 0x20;
  uStack_130 = 0x1120f0;
  local_e4 = snd_midi_event_new(0,puVar4 + 3);
  local_7c = local_e4;
  if (local_e4 < 0) {
    *(undefined1 *)((long)ptr + 0x39) = 0;
    uStack_130 = 0x112122;
    std::operator<<((ostream *)&std::cerr,
                    "\nMidiInAlsa::alsaMidiHandler: error initializing MIDI event parser!\n\n");
    psVar17 = (snd_seq_event_t *)auStack_128;
  }
  else {
    uStack_130 = 0x112166;
    _res = (uchar *)malloc((ulong)*(uint *)(puVar4 + 4));
    if (_res == (uchar *)0x0) {
      *(undefined1 *)((long)ptr + 0x39) = 0;
      uStack_130 = 0x11218c;
      snd_midi_event_free(puVar4[3]);
      puVar4[3] = 0;
      uStack_130 = 0x1121ad;
      std::operator<<((ostream *)&std::cerr,
                      "\nMidiInAlsa::alsaMidiHandler: error initializing buffer memory!\n\n");
    }
    else {
      uStack_130 = 0x1121d3;
      snd_midi_event_init(puVar4[3]);
      uStack_130 = 0x1121e7;
      snd_midi_event_no_status(puVar4[3],1);
      uStack_130 = 0x1121fa;
      iVar12 = snd_seq_poll_descriptors_count(*puVar4,1);
      poll_fds._4_4_ = iVar12 + 1;
      lVar7 = -((long)poll_fds._4_4_ * 8 + 0xfU & 0xfffffffffffffff0);
      psVar17 = (snd_seq_event_t *)(auStack_128 + lVar7);
      uVar5 = *puVar4;
      local_e8 = iVar12;
      ev = psVar17;
      *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x112248;
      snd_seq_poll_descriptors(uVar5,auStack_128 + lVar7 + 8,iVar12,1);
      uVar1 = *(undefined4 *)((long)puVar4 + 0x4c);
      psVar8 = ev;
      psVar8->type = (char)uVar1;
      psVar8->flags = (char)((uint)uVar1 >> 8);
      psVar8->tag = (char)((uint)uVar1 >> 0x10);
      psVar8->queue = (char)((uint)uVar1 >> 0x18);
      *(undefined2 *)&ev->time = 1;
      while (puVar9 = _res, (*(byte *)((long)ptr + 0x39) & 1) != 0) {
        uVar5 = *puVar4;
        *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x112280;
        local_ec = snd_seq_event_input_pending(uVar5,1);
        psVar8 = ev;
        if (local_ec == 0) {
          __nfds = (nfds_t)poll_fds._4_4_;
          *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x1122a5;
          local_f0 = poll((pollfd *)psVar8,__nfds,-1);
          if ((-1 < local_f0) && (((ulong)ev->time & 0x10000) != 0)) {
            iVar12._0_1_ = ev->type;
            iVar12._1_1_ = ev->flags;
            iVar12._2_1_ = ev->tag;
            iVar12._3_1_ = ev->queue;
            *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x1122df;
            local_f8 = read(iVar12,&local_99,1);
            local_a0 = (undefined4)local_f8;
          }
        }
        else {
          uVar5 = *puVar4;
          *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x11230c;
          local_fc = snd_seq_event_input(uVar5,&stack0xffffffffffffff88);
          local_7c = local_fc;
          if (local_fc == -0x1c) {
            *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x112336;
            std::operator<<((ostream *)&std::cerr,
                            "\nMidiInAlsa::alsaMidiHandler: MIDI input buffer overrun!\n\n");
          }
          else if (local_fc < 1) {
            *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x112356;
            std::operator<<((ostream *)&std::cerr,
                            "\nMidiInAlsa::alsaMidiHandler: unknown MIDI input error!\n");
            *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x112364;
            perror("System reports");
          }
          else {
            if ((message.timeStamp._7_1_ & 1) == 0) {
              *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x11237c;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
            }
            puVar9 = _res;
            message.timeStamp._6_1_ = 0;
            local_100 = (uint)*pbStack_78;
            if (local_100 == 0x16) {
              message.timeStamp._6_1_ = (*(byte *)((long)ptr + 0x38) & 2) == 0;
            }
            else if (local_100 == 0x24) {
              message.timeStamp._6_1_ = (*(byte *)((long)ptr + 0x38) & 2) == 0;
            }
            else if (local_100 == 0x25) {
              message.timeStamp._6_1_ = (*(byte *)((long)ptr + 0x38) & 2) == 0;
            }
            else if (local_100 == 0x2a) {
              message.timeStamp._6_1_ = (*(byte *)((long)ptr + 0x38) & 4) == 0;
            }
            else if ((local_100 != 0x42) && (local_100 != 0x43)) {
              if (local_100 == 0x82) {
                if ((*(byte *)((long)ptr + 0x38) & 1) == 0) {
                  if (*(uint *)(puVar4 + 4) < *(uint *)(pbStack_78 + 0x10)) {
                    *(undefined4 *)(puVar4 + 4) = *(undefined4 *)(pbStack_78 + 0x10);
                    *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x112499;
                    free(puVar9);
                    uVar2 = *(uint *)(puVar4 + 4);
                    *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x1124a7;
                    _res = (uchar *)malloc((ulong)uVar2);
                    if (_res == (uchar *)0x0) {
                      *(undefined1 *)((long)ptr + 0x39) = 0;
                      *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x1124d3;
                      std::operator<<((ostream *)&std::cerr,
                                      "\nMidiInAlsa::alsaMidiHandler: error resizing buffer memory!\n\n"
                                     );
                      goto LAB_001124e3;
                    }
                  }
                  message.timeStamp._6_1_ = 1;
                }
              }
              else {
                message.timeStamp._6_1_ = 1;
              }
            }
LAB_001124e3:
            pbVar10 = pbStack_78;
            puVar9 = _res;
            puVar11 = message.bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            if ((message.timeStamp._6_1_ & 1) != 0) {
              uVar5 = puVar4[3];
              uVar1 = *(undefined4 *)(puVar4 + 4);
              *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x11250a;
              lVar13 = snd_midi_event_decode(uVar5,puVar9,uVar1,pbVar10);
              puVar9 = _res;
              local_108 = lVar13;
              puVar11 = message.bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              if (0 < lVar13) {
                if ((message.timeStamp._7_1_ & 1) == 0) {
                  puVar16 = _res + lVar13;
                  *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x112549;
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  assign<unsigned_char*,void>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_60,puVar9,
                             puVar16);
                }
                else {
                  auStack_128._16_8_ =
                       (vector<unsigned_char,std::allocator<unsigned_char>> *)local_60;
                  *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x11255d;
                  local_b0._M_current =
                       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_60);
                  *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x112577;
                  __gnu_cxx::
                  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::__normal_iterator<unsigned_char*>
                            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)&local_a8,&local_b0);
                  puVar9 = _res;
                  __position._M_current = local_a8._M_current;
                  uVar5 = auStack_128._16_8_;
                  puVar16 = _res + lVar13;
                  *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x11259b;
                  local_110 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                                       insert<unsigned_char*,void>
                                                 ((
                                                  vector<unsigned_char,std::allocator<unsigned_char>>
                                                  *)uVar5,__position,puVar9,puVar16);
                }
                auStack_128[0xf] = false;
                if (*pbStack_78 == 0x82) {
                  *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x1125d2;
                  pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       local_60);
                  auStack_128[0xf] = *pvVar14 != 0xf7;
                }
                message.timeStamp._7_1_ = auStack_128[0xf];
                puVar11 = message.bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
                if ((bool)auStack_128[0xf] == false) {
                  message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  y.tv_nsec = (__syscall_slong_t)(pbStack_78 + 4);
                  y.tv_sec = (__time_t)*(uint *)((long)puVar4 + 0x44);
                  _nsec_1 = (ulong)*(uint *)(puVar4 + 8);
                  if ((ulong)*(uint *)(pbStack_78 + 8) < (ulong)y.tv_sec) {
                    callback._4_4_ = (int)((y.tv_sec - *(int *)(pbStack_78 + 8)) / 1000000000) + 1;
                    y.tv_sec = y.tv_sec - callback._4_4_ * 1000000000;
                    _nsec_1 = (long)callback._4_4_ + _nsec_1;
                  }
                  if (1000000000 < (long)((ulong)*(uint *)(pbStack_78 + 8) - y.tv_sec)) {
                    callback._0_4_ = (int)((*(int *)(pbStack_78 + 8) - y.tv_sec) / 1000000000);
                    y.tv_sec = (int)callback * 1000000000 + y.tv_sec;
                    _nsec_1 = _nsec_1 - (long)(int)callback;
                  }
                  iVar12 = *(int *)y.tv_nsec;
                  iVar3 = *(int *)(pbStack_78 + 8);
                  puVar4[8] = *(undefined8 *)(pbStack_78 + 4);
                  puVar11 = (pointer)((double)(iVar3 - y.tv_sec) * 1e-09 +
                                     (double)(long)((long)iVar12 - _nsec_1));
                  if ((*(byte *)((long)ptr + 0x3a) & 1) == 1) {
                    *(undefined1 *)((long)ptr + 0x3a) = 0;
                    puVar11 = message.bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage;
                  }
                }
              }
            }
            message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = puVar11;
            pbVar10 = pbStack_78;
            *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x11278f;
            snd_seq_free_event(pbVar10);
            *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x11279a;
            sVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
            puVar11 = message.bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            if ((sVar15 != 0) && ((message.timeStamp._7_1_ & 1) == 0)) {
              if ((*(byte *)((long)ptr + 0x48) & 1) == 0) {
                *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x1127ef;
                auStack_128[0xe] =
                     MidiInApi::MidiQueue::push((MidiQueue *)ptr,(MidiMessage *)local_60);
                if (!(bool)auStack_128[0xe]) {
                  *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x112816;
                  std::operator<<((ostream *)&std::cerr,
                                  "\nMidiInAlsa: message queue limit reached!!\n\n");
                }
              }
              else {
                pcVar6 = *(code **)((long)ptr + 0x50);
                uVar5 = *(undefined8 *)((long)ptr + 0x58);
                local_e0 = pcVar6;
                *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x1127de;
                (*pcVar6)(puVar11,local_60,uVar5);
              }
            }
          }
        }
      }
      if (_res != (uchar *)0x0) {
        *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x112837;
        free(puVar9);
      }
      uVar5 = puVar4[3];
      *(undefined8 *)(auStack_128 + lVar7 + -8) = 0x112844;
      snd_midi_event_free(uVar5);
      puVar4[3] = 0;
      puVar4[6] = puVar4[7];
    }
  }
  buffer._0_4_ = 1;
  psVar17[-1].data.ext.ptr = (void *)0x11287d;
  MidiInApi::MidiMessage::~MidiMessage((MidiMessage *)local_60);
  return (void *)0x0;
}

Assistant:

static void *alsaMidiHandler( void *ptr )
{
  MidiInApi::RtMidiInData *data = static_cast<MidiInApi::RtMidiInData *> (ptr);
  AlsaMidiData *apiData = static_cast<AlsaMidiData *> (data->apiData);

  long nBytes;
  double time;
  bool continueSysex = false;
  bool doDecode = false;
  MidiInApi::MidiMessage message;
  int poll_fd_count;
  struct pollfd *poll_fds;

  snd_seq_event_t *ev;
  int result;
  apiData->bufferSize = 32;
  result = snd_midi_event_new( 0, &apiData->coder );
  if ( result < 0 ) {
    data->doInput = false;
    std::cerr << "\nMidiInAlsa::alsaMidiHandler: error initializing MIDI event parser!\n\n";
    return 0;
  }
  unsigned char *buffer = (unsigned char *) malloc( apiData->bufferSize );
  if ( buffer == NULL ) {
    data->doInput = false;
    snd_midi_event_free( apiData->coder );
    apiData->coder = 0;
    std::cerr << "\nMidiInAlsa::alsaMidiHandler: error initializing buffer memory!\n\n";
    return 0;
  }
  snd_midi_event_init( apiData->coder );
  snd_midi_event_no_status( apiData->coder, 1 ); // suppress running status messages

  poll_fd_count = snd_seq_poll_descriptors_count( apiData->seq, POLLIN ) + 1;
  poll_fds = (struct pollfd*)alloca( poll_fd_count * sizeof( struct pollfd ));
  snd_seq_poll_descriptors( apiData->seq, poll_fds + 1, poll_fd_count - 1, POLLIN );
  poll_fds[0].fd = apiData->trigger_fds[0];
  poll_fds[0].events = POLLIN;

  while ( data->doInput ) {

    if ( snd_seq_event_input_pending( apiData->seq, 1 ) == 0 ) {
      // No data pending
      if ( poll( poll_fds, poll_fd_count, -1) >= 0 ) {
        if ( poll_fds[0].revents & POLLIN ) {
          bool dummy;
          int res = read( poll_fds[0].fd, &dummy, sizeof(dummy) );
          (void) res;
        }
      }
      continue;
    }

    // If here, there should be data.
    result = snd_seq_event_input( apiData->seq, &ev );
    if ( result == -ENOSPC ) {
      std::cerr << "\nMidiInAlsa::alsaMidiHandler: MIDI input buffer overrun!\n\n";
      continue;
    }
    else if ( result <= 0 ) {
      std::cerr << "\nMidiInAlsa::alsaMidiHandler: unknown MIDI input error!\n";
      perror("System reports");
      continue;
    }

    // This is a bit weird, but we now have to decode an ALSA MIDI
    // event (back) into MIDI bytes.  We'll ignore non-MIDI types.
    if ( !continueSysex ) message.bytes.clear();

    doDecode = false;
    switch ( ev->type ) {

    case SND_SEQ_EVENT_PORT_SUBSCRIBED:
#if defined(__RTMIDI_DEBUG__)
      std::cout << "MidiInAlsa::alsaMidiHandler: port connection made!\n";
#endif
      break;

    case SND_SEQ_EVENT_PORT_UNSUBSCRIBED:
#if defined(__RTMIDI_DEBUG__)
      std::cerr << "MidiInAlsa::alsaMidiHandler: port connection has closed!\n";
      std::cout << "sender = " << (int) ev->data.connect.sender.client << ":"
                << (int) ev->data.connect.sender.port
                << ", dest = " << (int) ev->data.connect.dest.client << ":"
                << (int) ev->data.connect.dest.port
                << std::endl;
#endif
      break;

    case SND_SEQ_EVENT_QFRAME: // MIDI time code
      if ( !( data->ignoreFlags & 0x02 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_TICK: // 0xF9 ... MIDI timing tick
      if ( !( data->ignoreFlags & 0x02 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_CLOCK: // 0xF8 ... MIDI timing (clock) tick
      if ( !( data->ignoreFlags & 0x02 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_SENSING: // Active sensing
      if ( !( data->ignoreFlags & 0x04 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_SYSEX:
      if ( (data->ignoreFlags & 0x01) ) break;
      if ( ev->data.ext.len > apiData->bufferSize ) {
        apiData->bufferSize = ev->data.ext.len;
        free( buffer );
        buffer = (unsigned char *) malloc( apiData->bufferSize );
        if ( buffer == NULL ) {
          data->doInput = false;
          std::cerr << "\nMidiInAlsa::alsaMidiHandler: error resizing buffer memory!\n\n";
          break;
        }
      }
      doDecode = true;
      break;

    default:
      doDecode = true;
    }

    if ( doDecode ) {

      nBytes = snd_midi_event_decode( apiData->coder, buffer, apiData->bufferSize, ev );
      if ( nBytes > 0 ) {
        // The ALSA sequencer has a maximum buffer size for MIDI sysex
        // events of 256 bytes.  If a device sends sysex messages larger
        // than this, they are segmented into 256 byte chunks.  So,
        // we'll watch for this and concatenate sysex chunks into a
        // single sysex message if necessary.
        if ( !continueSysex )
          message.bytes.assign( buffer, &buffer[nBytes] );
        else
          message.bytes.insert( message.bytes.end(), buffer, &buffer[nBytes] );

        continueSysex = ( ( ev->type == SND_SEQ_EVENT_SYSEX ) && ( message.bytes.back() != 0xF7 ) );
        if ( !continueSysex ) {

          // Calculate the time stamp:
          message.timeStamp = 0.0;

          // Method 1: Use the system time.
          //(void)gettimeofday(&tv, (struct timezone *)NULL);
          //time = (tv.tv_sec * 1000000) + tv.tv_usec;

          // Method 2: Use the ALSA sequencer event time data.
          // (thanks to Pedro Lopez-Cabanillas!).

          // Using method from:
          // https://www.gnu.org/software/libc/manual/html_node/Elapsed-Time.html

          // Perform the carry for the later subtraction by updating y.
          // Temp var y is timespec because computation requires signed types,
          // while snd_seq_real_time_t has unsigned types.
          snd_seq_real_time_t &x( ev->time.time );
          struct timespec y;
          y.tv_nsec = apiData->lastTime.tv_nsec;
          y.tv_sec = apiData->lastTime.tv_sec;
          if ( x.tv_nsec < y.tv_nsec ) {
              int nsec = (y.tv_nsec - (int)x.tv_nsec) / 1000000000 + 1;
              y.tv_nsec -= 1000000000 * nsec;
              y.tv_sec += nsec;
          }
          if ( x.tv_nsec - y.tv_nsec > 1000000000 ) {
              int nsec = ((int)x.tv_nsec - y.tv_nsec) / 1000000000;
              y.tv_nsec += 1000000000 * nsec;
              y.tv_sec -= nsec;
          }

          // Compute the time difference.
          time = (int)x.tv_sec - y.tv_sec + ((int)x.tv_nsec - y.tv_nsec)*1e-9;

          apiData->lastTime = ev->time.time;

          if ( data->firstMessage == true )
            data->firstMessage = false;
          else
            message.timeStamp = time;
        }
        else {
#if defined(__RTMIDI_DEBUG__)
          std::cerr << "\nMidiInAlsa::alsaMidiHandler: event parsing error or not a MIDI event!\n\n";
#endif
        }
      }
    }

    snd_seq_free_event( ev );
    if ( message.bytes.size() == 0 || continueSysex ) continue;

    if ( data->usingCallback ) {
      RtMidiIn::RtMidiCallback callback = (RtMidiIn::RtMidiCallback) data->userCallback;
      callback( message.timeStamp, &message.bytes, data->userData );
    }
    else {
      // As long as we haven't reached our queue size limit, push the message.
      if ( !data->queue.push( message ) )
        std::cerr << "\nMidiInAlsa: message queue limit reached!!\n\n";
    }
  }

  if ( buffer ) free( buffer );
  snd_midi_event_free( apiData->coder );
  apiData->coder = 0;
  apiData->thread = apiData->dummy_thread_id;
  return 0;
}